

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_private.hh
# Opt level: O1

void __thiscall QPDF::EncryptionParameters::EncryptionParameters(EncryptionParameters *this)

{
  _Rb_tree_header *p_Var1;
  
  this->encrypted = false;
  this->encryption_initialized = false;
  this->encryption_V = 0;
  this->encryption_R = 0;
  this->encrypt_metadata = true;
  p_Var1 = &(this->crypt_filters)._M_t._M_impl.super__Rb_tree_header;
  (this->crypt_filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->crypt_filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->crypt_filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->crypt_filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->crypt_filters)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->cf_stream = e_none;
  this->cf_string = e_none;
  this->cf_file = e_none;
  (this->provided_password)._M_dataplus._M_p = (pointer)&(this->provided_password).field_2;
  (this->provided_password)._M_string_length = 0;
  (this->provided_password).field_2._M_local_buf[0] = '\0';
  (this->user_password)._M_dataplus._M_p = (pointer)&(this->user_password).field_2;
  (this->user_password)._M_string_length = 0;
  (this->user_password).field_2._M_local_buf[0] = '\0';
  (this->encryption_key)._M_dataplus._M_p = (pointer)&(this->encryption_key).field_2;
  (this->encryption_key)._M_string_length = 0;
  (this->encryption_key).field_2._M_local_buf[0] = '\0';
  (this->cached_object_encryption_key)._M_dataplus._M_p =
       (pointer)&(this->cached_object_encryption_key).field_2;
  (this->cached_object_encryption_key)._M_string_length = 0;
  (this->cached_object_encryption_key).field_2._M_local_buf[0] = '\0';
  this->user_password_matched = false;
  this->owner_password_matched = false;
  (this->cached_key_og).obj = 0;
  (this->cached_key_og).gen = 0;
  return;
}

Assistant:

EncryptionParameters() = default;